

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O2

Light * rw::Light::streamRead(Stream *stream)

{
  FILE *__stream;
  bool bVar1;
  Light *this;
  char *pcVar2;
  uint32 version;
  LightChunkData buf;
  
  bVar1 = findChunk(stream,1,(uint32 *)0x0,&version);
  if (bVar1) {
    Stream::read32(stream,&buf,0x18);
    this = create((uint)buf.type_flags._2_2_);
    if (this != (Light *)0x0) {
      this->radius = buf.radius;
      (this->color).red = buf.red;
      (this->color).green = buf.green;
      (this->color).blue = buf.blue;
      (this->object).object.privateFlags =
           -((float)buf.green == (float)buf.red) & -((float)buf.blue == (float)buf.red) & 1;
      if (version < 0x30300) {
        buf.minusCosAngle =
             (float32)(-1.0 / SQRT((float)buf.minusCosAngle * (float)buf.minusCosAngle + 1.0));
      }
      this->minusCosAngle = buf.minusCosAngle;
      (this->object).object.flags = (uint8)buf.type_flags;
      bVar1 = PluginList::streamRead((PluginList *)&s_plglist,stream,this);
      if (bVar1) {
        return this;
      }
      destroy(this);
    }
  }
  else {
    buf.radius = 2.52234e-44;
    buf.red = -5.60519e-45;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/light.cpp",0x71);
    __stream = _stderr;
    pcVar2 = dbgsprint(0x80000004,"STRUCT");
    fprintf(__stream,"%s\n",pcVar2);
    setError((Error *)&buf);
  }
  return (Light *)0x0;
}

Assistant:

Light*
Light::streamRead(Stream *stream)
{
	uint32 version;
	LightChunkData buf;

	if(!findChunk(stream, ID_STRUCT, nil, &version)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	stream->read32(&buf, sizeof(LightChunkData));
	Light *light = Light::create(buf.type_flags>>16);
	if(light == nil)
		return nil;
	light->radius = buf.radius;
	light->setColor(buf.red, buf.green, buf.blue);
	float32 a = buf.minusCosAngle;
	if(version >= 0x30300)
		light->minusCosAngle = a;
	else
		// tan -> -cos
		light->minusCosAngle = -1.0f/sqrtf(a*a+1.0f);
	light->object.object.flags = (uint8)buf.type_flags;
	if(s_plglist.streamRead(stream, light))
		return light;
	light->destroy();
	return nil;
}